

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.cpp
# Opt level: O0

void * NortekDVLThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double local_e88;
  double local_e80;
  interval local_e78;
  double local_e60;
  interval local_e58;
  interval local_e40;
  double local_e28;
  double local_e20;
  interval local_e18;
  double local_e00;
  double local_df8;
  interval local_df0;
  double local_dd8;
  double local_dd0;
  interval local_dc8;
  double local_db0;
  interval local_da8;
  interval local_d90;
  interval local_d78;
  double local_d60;
  interval local_d58;
  double local_d40;
  interval local_d38;
  interval local_d20;
  double local_d08;
  interval local_d00;
  interval local_ce8;
  interval local_cd0;
  double local_cb8;
  interval local_cb0;
  interval local_c98;
  interval local_c80;
  double local_c68;
  interval local_c60;
  double local_c48;
  interval local_c40;
  interval local_c28;
  double local_c10;
  interval local_c08;
  double local_bf0;
  interval local_be8;
  interval local_bd0;
  char local_bb8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_9ac;
  int local_9a8;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_950 [4];
  BOOL bConnected;
  NMEADATA nmeadata;
  NORTEKDVL nortekdvl;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 100;
  local_9a8 = 0;
  nortekdvl._1376_8_ = pParam;
  memset(&nmeadata.AIS_COG,0,0x568);
  memset(local_950,0,0x3d8);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPauseNortekDVL == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("NortekDVL paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG);
      }
      if (bExit != 0) goto LAB_001c5286;
      mSleep(100);
    }
    if (bRestartNortekDVL != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a NortekDVL.\n");
        chrono_period._68_4_ = 0;
        DisconnectNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG);
      }
      bRestartNortekDVL = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG,"NortekDVL0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = nortekdvl.BaudRate;
        memset(local_950,0,0x3d8);
        if (nortekdvl.RS232Port._784_8_ != 0) {
          fclose((FILE *)nortekdvl.RS232Port._784_8_);
          nortekdvl.RS232Port.DevType = 0;
          nortekdvl.RS232Port._788_4_ = 0;
        }
        if ((nortekdvl.timeout != 0) && (nortekdvl.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&nortekdvl.LastAltitude);
          if (sVar2 == 0) {
            sprintf(local_bb8,"nortekdvl");
          }
          else {
            sprintf(local_bb8,"%.127s",&nortekdvl.LastAltitude);
          }
          sVar2 = strlen(local_bb8);
          local_9ac = (int)sVar2;
          do {
            local_9ac = local_9ac + -1;
            if (local_9ac < 0) break;
          } while (local_bb8[local_9ac] != '.');
          if ((0 < local_9ac) && (sVar2 = strlen(local_bb8), local_9ac < (int)sVar2)) {
            sVar2 = strlen(local_bb8);
            memset(local_bb8 + local_9ac,0,sVar2 - (long)local_9ac);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_bb8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          nortekdvl.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)nortekdvl.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create NortekDVL data file.\n");
            goto LAB_001c5286;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetNMEASentenceNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG,(NMEADATA *)local_950);
      if (iVar1 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        if ((((nortekdvl.threadperiod != 0) || (nortekdvl.bSaveRawData != 0)) ||
            (nortekdvl.bEnable_PD6_SA != 0)) ||
           (((nortekdvl.bEnable_PD6_TS != 0 || (nortekdvl.bEnable_PD6_BI != 0)) ||
            (nortekdvl.bEnable_PD6_BS != 0)))) {
          if (nortekdvl.threadperiod != 0) {
            local_bf0 = fmod_2PI((1.5707963267948966 - nmeadata.Pitch) - angle_env);
            interval::interval(&local_be8,&local_bf0);
            local_c10 = -psi_ahrs_acc;
            interval::interval(&local_c08,&local_c10,&psi_ahrs_acc);
            operator+(&local_bd0,&local_be8,&local_c08);
            interval::operator=((interval *)&psi_ahrs,&local_bd0);
            local_c48 = -nmeadata.Roll;
            interval::interval(&local_c40,&local_c48);
            local_c68 = -theta_ahrs_acc;
            interval::interval(&local_c60,&local_c68,&theta_ahrs_acc);
            operator+(&local_c28,&local_c40,&local_c60);
            interval::operator=((interval *)&theta_ahrs,&local_c28);
            interval::interval(&local_c98,&nmeadata.second);
            local_cb8 = -phi_ahrs_acc;
            interval::interval(&local_cb0,&local_cb8,&phi_ahrs_acc);
            operator+(&local_c80,&local_c98,&local_cb0);
            interval::operator=((interval *)&phi_ahrs,&local_c80);
          }
          if (nortekdvl.bEnable_PD6_TS != 0) {
            if (nmeadata.v_up._1_1_ == 'A') {
              interval::interval(&local_ce8,&nmeadata.vt_ship);
              local_d08 = -dvl_acc;
              interval::interval(&local_d00,&local_d08,&dvl_acc);
              operator+(&local_cd0,&local_ce8,&local_d00);
              interval::operator=((interval *)&vrx_dvl,&local_cd0);
              local_d40 = -nmeadata.verr_dvl;
              interval::interval(&local_d38,&local_d40);
              local_d60 = -dvl_acc;
              interval::interval(&local_d58,&local_d60,&dvl_acc);
              operator+(&local_d20,&local_d38,&local_d58);
              interval::operator=((interval *)&vry_dvl,&local_d20);
              interval::interval(&local_d90,&nmeadata.vl_ship);
              local_db0 = -dvl_acc;
              interval::interval(&local_da8,&local_db0,&dvl_acc);
              operator+(&local_d78,&local_d90,&local_da8);
              interval::operator=((interval *)&vrz_dvl,&local_d78);
            }
            else if (nmeadata.v_up._1_1_ == 'V') {
              local_dd0 = -10000.0;
              local_dd8 = 10000.0;
              interval::interval(&local_dc8,&local_dd0,&local_dd8);
              interval::operator=((interval *)&vrx_dvl,&local_dc8);
              local_df8 = -10000.0;
              local_e00 = 10000.0;
              interval::interval(&local_df0,&local_df8,&local_e00);
              interval::operator=((interval *)&vry_dvl,&local_df0);
              local_e20 = -10000.0;
              local_e28 = 10000.0;
              interval::interval(&local_e18,&local_e20,&local_e28);
              interval::operator=((interval *)&vrz_dvl,&local_e18);
            }
          }
          if ((nortekdvl.bEnable_PD6_BI != 0) && (nmeadata.v_up._2_1_ == 'A')) {
            sog = nmeadata.Altitude_AGL;
            local_e60 = fmod_2PI((1.5707963267948966 - nmeadata.SOG) - angle_env);
            interval::interval(&local_e58,&local_e60);
            local_e80 = -3.141592653589793;
            local_e88 = 3.141592653589793;
            interval::interval(&local_e78,&local_e80,&local_e88);
            operator+(&local_e40,&local_e58,&local_e78);
            interval::operator=((interval *)&psi_dvl,&local_e40);
          }
          if ((nortekdvl.bEnable_PD6_BS != 0) && (nmeadata.rangetobottom < 4.0)) {
            altitude_AGL = nmeadata.Altitude;
          }
        }
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a NortekDVL lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG);
        mSleep((long)i);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_9a8 = local_9a8 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_9a8)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c5286:
      StopChronoQuick((CHRONO *)&errcount);
      if (nortekdvl.RS232Port._784_8_ != 0) {
        fclose((FILE *)nortekdvl.RS232Port._784_8_);
        nortekdvl.RS232Port.DevType = 0;
        nortekdvl.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectNortekDVL((NORTEKDVL *)&nmeadata.AIS_COG);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NortekDVLThread(void* pParam)
{
	NORTEKDVL nortekdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&nortekdvl, 0, sizeof(NORTEKDVL));

	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseNortekDVL)
		{
			if (bConnected)
			{
				printf("NortekDVL paused.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNortekDVL)
		{
			if (bConnected)
			{
				printf("Restarting a NortekDVL.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			bRestartNortekDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNortekDVL(&nortekdvl, "NortekDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nortekdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nortekdvl.pfSaveFile != NULL)
				{
					fclose(nortekdvl.pfSaveFile); 
					nortekdvl.pfSaveFile = NULL;
				}
				if ((nortekdvl.bSaveRawData)&&(nortekdvl.pfSaveFile == NULL)) 
				{
					if (strlen(nortekdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nortekdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nortekdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nortekdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nortekdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create NortekDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentenceNortekDVL(&nortekdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (nortekdvl.bEnable_PD6_SA||nortekdvl.bEnable_PD6_TS||nortekdvl.bEnable_PD6_BI||nortekdvl.bEnable_PD6_BS||
					nortekdvl.bEnable_PD6_BE||nortekdvl.bEnable_PD6_BD)
				{
					if (nortekdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (nortekdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (nortekdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (nortekdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NortekDVL lost.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
				mSleep(threadperiod);
			}
		}

		//printf("NortekDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (nortekdvl.pfSaveFile != NULL)
	{
		fclose(nortekdvl.pfSaveFile); 
		nortekdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNortekDVL(&nortekdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}